

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfConvert.cpp
# Opt level: O3

half Imf_2_5::floatToHalf(float f)

{
  unsigned_short uVar1;
  
  if ((0x7f7fffff < (uint)ABS(f)) ||
     ((uVar1 = 0x7c00, f <= 65504.0 && (uVar1 = 0xfc00, -65504.0 <= f)))) {
    if ((f != 0.0) || (NAN(f))) {
      if (half::_eLut[(uint)f >> 0x17] == 0) {
        uVar1 = half::convert((int)f);
        return (half)uVar1;
      }
      return (half)(half::_eLut[(uint)f >> 0x17] +
                   (short)(((uint)f & 0x7fffff) + 0xfff + (uint)(((uint)f >> 0xd & 1) != 0) >> 0xd))
      ;
    }
    uVar1 = (unsigned_short)((uint)f >> 0x10);
  }
  return (half)uVar1;
}

Assistant:

half	
floatToHalf (float f)
{
    if (isFinite (f))
    {
	if (f >  HALF_MAX)
	    return half::posInf();

	if (f < -HALF_MAX)
	    return half::negInf();
    }

    return half (f);
}